

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Reader.cpp
# Opt level: O2

void __thiscall adios2::core::engine::BP5Reader::PerformGets(BP5Reader *this)

{
  ArrayOrdering AVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  EVPathRemote *this_00;
  Remote *pRVar5;
  allocator local_143;
  allocator local_142;
  allocator local_141;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  string local_c0;
  string RemoteName;
  string local_80 [32];
  string local_60 [32];
  string local_40;
  
  if ((this->m_dataIsRemote == true) &&
     ((this->m_Remote)._M_t.
      super___uniq_ptr_impl<adios2::Remote,_std::default_delete<adios2::Remote>_>._M_t.
      super__Tuple_impl<0UL,_adios2::Remote_*,_std::default_delete<adios2::Remote>_>.
      super__Head_base<0UL,_adios2::Remote_*,_false>._M_head_impl == (Remote *)0x0)) {
    if ((this->m_BP5Deserializer->PendingGetRequests).
        super__Vector_base<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->m_BP5Deserializer->PendingGetRequests).
        super__Vector_base<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      return;
    }
    AVar1 = ((this->super_Engine).m_IO)->m_ArrayOrder;
    RemoteName._M_dataplus._M_p = (pointer)&RemoteName.field_2;
    RemoteName._M_string_length = 0;
    RemoteName.field_2._M_local_buf[0] = '\0';
    if ((((this->super_BP5Engine).m_Parameters.RemoteDataPath._M_string_length != 0) ||
        (pcVar4 = getenv("DoRemote"), pcVar4 != (char *)0x0)) ||
       (pcVar4 = getenv("DoXRootD"), pcVar4 != (char *)0x0)) {
      std::__cxx11::string::_M_assign((string *)&RemoteName);
    }
    this_00 = (EVPathRemote *)operator_new(0x140);
    EVPathRemote::EVPathRemote(this_00,(this->super_Engine).m_HostOptions);
    pRVar5 = (this->m_Remote)._M_t.
             super___uniq_ptr_impl<adios2::Remote,_std::default_delete<adios2::Remote>_>._M_t.
             super__Tuple_impl<0UL,_adios2::Remote_*,_std::default_delete<adios2::Remote>_>.
             super__Head_base<0UL,_adios2::Remote_*,_false>._M_head_impl;
    (this->m_Remote)._M_t.
    super___uniq_ptr_impl<adios2::Remote,_std::default_delete<adios2::Remote>_>._M_t.
    super__Tuple_impl<0UL,_adios2::Remote_*,_std::default_delete<adios2::Remote>_>.
    super__Head_base<0UL,_adios2::Remote_*,_false>._M_head_impl = (Remote *)this_00;
    if (pRVar5 != (Remote *)0x0) {
      (*pRVar5->_vptr_Remote[1])();
      this_00 = (EVPathRemote *)
                (this->m_Remote)._M_t.
                super___uniq_ptr_impl<adios2::Remote,_std::default_delete<adios2::Remote>_>._M_t.
                super__Tuple_impl<0UL,_adios2::Remote_*,_std::default_delete<adios2::Remote>_>.
                super__Head_base<0UL,_adios2::Remote_*,_false>._M_head_impl;
    }
    std::__cxx11::string::string
              ((string *)&local_40,(string *)&(this->super_BP5Engine).m_Parameters.RemoteHost);
    uVar2 = Remote::LaunchRemoteServerViaConnectionManager(&this_00->super_Remote,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    pRVar5 = (this->m_Remote)._M_t.
             super___uniq_ptr_impl<adios2::Remote,_std::default_delete<adios2::Remote>_>._M_t.
             super__Tuple_impl<0UL,_adios2::Remote_*,_std::default_delete<adios2::Remote>_>.
             super__Head_base<0UL,_adios2::Remote_*,_false>._M_head_impl;
    std::__cxx11::string::string(local_60,"localhost",(allocator *)&local_140);
    std::__cxx11::string::string(local_80,(string *)&RemoteName);
    (*pRVar5->_vptr_Remote[3])
              (pRVar5,local_60,(ulong)uVar2,local_80,(ulong)(this->super_Engine).m_OpenMode,
               (ulong)(AVar1 == RowMajor));
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_60);
    pRVar5 = (this->m_Remote)._M_t.
             super___uniq_ptr_impl<adios2::Remote,_std::default_delete<adios2::Remote>_>._M_t.
             super__Tuple_impl<0UL,_adios2::Remote_*,_std::default_delete<adios2::Remote>_>.
             super__Head_base<0UL,_adios2::Remote_*,_false>._M_head_impl;
    if (pRVar5 == (Remote *)0x0) {
      std::__cxx11::string::string((string *)&local_140,"Engine",&local_141);
      std::__cxx11::string::string((string *)&local_c0,"BP5Reader",&local_142);
      std::__cxx11::string::string((string *)&local_e0,"OpenFiles",&local_143);
      std::operator+(&local_120,"Remote file ",&(this->super_Engine).m_Name);
      std::operator+(&local_100,&local_120,
                     " cannot be opened. Possible server or file specification error.");
      helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_140,&local_c0,&local_e0,&local_100,-1)
      ;
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_140);
      pRVar5 = (this->m_Remote)._M_t.
               super___uniq_ptr_impl<adios2::Remote,_std::default_delete<adios2::Remote>_>._M_t.
               super__Tuple_impl<0UL,_adios2::Remote_*,_std::default_delete<adios2::Remote>_>.
               super__Head_base<0UL,_adios2::Remote_*,_false>._M_head_impl;
    }
    iVar3 = (*pRVar5->_vptr_Remote[2])();
    if ((char)iVar3 == '\0') {
      std::__cxx11::string::string((string *)&local_140,"Engine",&local_141);
      std::__cxx11::string::string((string *)&local_c0,"BP5Reader",&local_142);
      std::__cxx11::string::string((string *)&local_e0,"OpenFiles",&local_143);
      std::operator+(&local_120,"Remote file ",&(this->super_Engine).m_Name);
      std::operator+(&local_100,&local_120,
                     " cannot be opened. Possible server or file specification error.");
      helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_140,&local_c0,&local_e0,&local_100,-1)
      ;
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_140);
    }
    std::__cxx11::string::~string((string *)&RemoteName);
  }
  if ((this->m_Remote)._M_t.
      super___uniq_ptr_impl<adios2::Remote,_std::default_delete<adios2::Remote>_>._M_t.
      super__Tuple_impl<0UL,_adios2::Remote_*,_std::default_delete<adios2::Remote>_>.
      super__Head_base<0UL,_adios2::Remote_*,_false>._M_head_impl == (Remote *)0x0) {
    PerformLocalGets(this);
  }
  else {
    PerformRemoteGets(this);
  }
  adios2::format::BP5Deserializer::ClearGetState(this->m_BP5Deserializer);
  return;
}

Assistant:

void BP5Reader::PerformGets()
{
    // if dataIsRemote is true and m_Remote is not true, this is our first time through
    // PerformGets() Either we don't need a remote open (m_dataIsRemote=false), or we need to Open
    // remote file (or die trying)
    if (m_dataIsRemote && !m_Remote)
    {
        bool RowMajorOrdering = (m_IO.m_ArrayOrder == ArrayOrdering::RowMajor);

        // If nothing is pending, don't open
        if (m_BP5Deserializer->PendingGetRequests.size() == 0)
            return;

        std::string RemoteName;
        if (!m_Parameters.RemoteDataPath.empty())
        {
            RemoteName = m_Parameters.RemoteDataPath;
        }
        else if (getenv("DoRemote") || getenv("DoXRootD"))
        {
            RemoteName = m_Name;
        }
        (void)RowMajorOrdering; // Use in case no remotes available
#ifdef ADIOS2_HAVE_XROOTD
        if (getenv("DoXRootD"))
        {
            m_Remote = std::unique_ptr<XrootdRemote>(new XrootdRemote(m_HostOptions));
            m_Remote->Open("localhost", 1094, m_Name, m_OpenMode, RowMajorOrdering);
        }
        else
#endif
#ifdef ADIOS2_HAVE_SST
        {
            m_Remote = std::unique_ptr<EVPathRemote>(new EVPathRemote(m_HostOptions));
            int localPort =
                m_Remote->LaunchRemoteServerViaConnectionManager(m_Parameters.RemoteHost);
            m_Remote->Open("localhost", localPort, RemoteName, m_OpenMode, RowMajorOrdering);
        }
#endif
#ifdef ADIOS2_HAVE_KVCACHE
        if (getenv("useKVCache"))
        {
            m_KVCache.OpenConnection();
            m_Fingerprint = m_Parameters.UUID;
            if (m_Fingerprint.empty())
            {
                m_KVCache.RemotePathHashMd5(RemoteName, m_Fingerprint);
            }
            m_KVCache.SetLocalCacheFile(m_Name + PathSeparator + "data");
        }
#endif
        if (m_Remote == nullptr)
        {
            helper::Throw<std::ios_base::failure>(
                "Engine", "BP5Reader", "OpenFiles",
                "Remote file " + m_Name +
                    " cannot be opened. Possible server or file specification error.");
        }
        if (!(*m_Remote)) // evaluate validity of object, not just that the pointer is non-NULL
        {
            helper::Throw<std::ios_base::failure>(
                "Engine", "BP5Reader", "OpenFiles",
                "Remote file " + m_Name +
                    " cannot be opened. Possible server or file specification error.");
        }
    }

    if (m_Remote)
    {
#ifdef ADIOS2_HAVE_KVCACHE
        if (getenv("useKVCache"))
        {
            PerformRemoteGetsWithKVCache();
        }
        else
        {
            PerformRemoteGets();
        }
#else
        PerformRemoteGets();
#endif
    }
    else
    {
        PerformLocalGets();
    }

    // clear pending requests inside deserializer
    m_BP5Deserializer->ClearGetState();
}